

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.cpp
# Opt level: O2

bool Diligent::PSOSerializer<(Diligent::SerializerMode)2>::SerializeCreateInfo
               (Serializer<(Diligent::SerializerMode)2> *Ser,
               ConstQual<RayTracingPipelineStateCreateInfo> *CreateInfo,
               ConstQual<TPRSNames> *PRSNames,DynamicLinearAllocator *Allocator,
               function<void_(unsigned_int_&,_Diligent::IShader_*const_&)> *ShaderToIndex)

{
  anon_class_24_3_79790419 ElemSerializer;
  anon_class_24_3_79790419 ElemSerializer_00;
  anon_class_24_3_79790419 ElemSerializer_01;
  bool bVar1;
  bool IsWriting;
  bool IsReading;
  undefined1 local_7a;
  bool local_79;
  undefined1 *local_78;
  function<void_(unsigned_int_&,_Diligent::IShader_*const_&)> *pfStack_70;
  bool *local_68;
  undefined1 *local_60;
  function<void_(unsigned_int_&,_Diligent::IShader_*const_&)> *pfStack_58;
  bool *local_50;
  undefined1 *local_48;
  function<void_(unsigned_int_&,_Diligent::IShader_*const_&)> *pfStack_40;
  bool *local_38;
  
  local_7a = Allocator == (DynamicLinearAllocator *)0x0;
  local_79 = !(bool)local_7a;
  bVar1 = SerializeCreateInfo(Ser,&CreateInfo->super_PipelineStateCreateInfo,PRSNames,Allocator);
  if (((bVar1) &&
      (bVar1 = Serializer<(Diligent::SerializerMode)2>::operator()
                         (Ser,&(CreateInfo->RayTracingPipeline).ShaderRecordSize,
                          &(CreateInfo->RayTracingPipeline).MaxRecursionDepth), bVar1)) &&
     (bVar1 = Serializer<(Diligent::SerializerMode)2>::operator()
                        (Ser,&CreateInfo->pShaderRecordName,&CreateInfo->MaxAttributeSize,
                         &CreateInfo->MaxPayloadSize), bVar1)) {
    ElemSerializer.ShaderToIndex = ShaderToIndex;
    ElemSerializer.IsWriting = (bool *)&local_7a;
    ElemSerializer.IsReading = &local_79;
    local_48 = &local_7a;
    pfStack_40 = ShaderToIndex;
    local_38 = &local_79;
    bVar1 = Serializer<(Diligent::SerializerMode)2>::
            SerializeArray<Diligent::RayTracingGeneralShaderGroup_const*const,unsigned_int_const,Diligent::PSOSerializer<(Diligent::SerializerMode)2>::SerializeCreateInfo(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::RayTracingPipelineStateCreateInfo_const&,std::array<char_const*,8ul>const&,Diligent::DynamicLinearAllocator*,std::function<void(unsigned_int&,Diligent::IShader*const&)>const&)::_lambda(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::RayTracingGeneralShaderGroup_const&)_1_>
                      (Ser,Allocator,&CreateInfo->pGeneralShaders,&CreateInfo->GeneralShaderCount,
                       ElemSerializer);
    if ((bVar1) &&
       (ElemSerializer_00.ShaderToIndex = ShaderToIndex,
       ElemSerializer_00.IsWriting = (bool *)&local_7a, ElemSerializer_00.IsReading = &local_79,
       local_60 = &local_7a, pfStack_58 = ShaderToIndex, local_50 = &local_79,
       bVar1 = Serializer<(Diligent::SerializerMode)2>::
               SerializeArray<Diligent::RayTracingTriangleHitShaderGroup_const*const,unsigned_int_const,Diligent::PSOSerializer<(Diligent::SerializerMode)2>::SerializeCreateInfo(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::RayTracingPipelineStateCreateInfo_const&,std::array<char_const*,8ul>const&,Diligent::DynamicLinearAllocator*,std::function<void(unsigned_int&,Diligent::IShader*const&)>const&)::_lambda(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::RayTracingTriangleHitShaderGroup_const&)_1_>
                         (Ser,Allocator,&CreateInfo->pTriangleHitShaders,
                          &CreateInfo->TriangleHitShaderCount,ElemSerializer_00), bVar1)) {
      ElemSerializer_01.ShaderToIndex = ShaderToIndex;
      ElemSerializer_01.IsWriting = (bool *)&local_7a;
      ElemSerializer_01.IsReading = &local_79;
      local_78 = &local_7a;
      pfStack_70 = ShaderToIndex;
      local_68 = &local_79;
      bVar1 = Serializer<(Diligent::SerializerMode)2>::
              SerializeArray<Diligent::RayTracingProceduralHitShaderGroup_const*const,unsigned_int_const,Diligent::PSOSerializer<(Diligent::SerializerMode)2>::SerializeCreateInfo(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::RayTracingPipelineStateCreateInfo_const&,std::array<char_const*,8ul>const&,Diligent::DynamicLinearAllocator*,std::function<void(unsigned_int&,Diligent::IShader*const&)>const&)::_lambda(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::RayTracingProceduralHitShaderGroup_const&)_1_>
                        (Ser,Allocator,&CreateInfo->pProceduralHitShaders,
                         &CreateInfo->ProceduralHitShaderCount,ElemSerializer_01);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool PSOSerializer<Mode>::SerializeCreateInfo(
    Serializer<Mode>&                                         Ser,
    ConstQual<RayTracingPipelineStateCreateInfo>&             CreateInfo,
    ConstQual<TPRSNames>&                                     PRSNames,
    DynamicLinearAllocator*                                   Allocator,
    const std::function<void(Uint32&, ConstQual<IShader*>&)>& ShaderToIndex)
{
    const bool IsReading = (Allocator != nullptr);
    const bool IsWriting = !IsReading;

    if (!SerializeCreateInfo(Ser, static_cast<ConstQual<PipelineStateCreateInfo>&>(CreateInfo), PRSNames, Allocator))
        return false;

    // Serialize RayTracingPipelineDesc
    if (!Ser(CreateInfo.RayTracingPipeline.ShaderRecordSize,
             CreateInfo.RayTracingPipeline.MaxRecursionDepth))
        return false;

    // Serialize RayTracingPipelineStateCreateInfo
    if (!Ser(CreateInfo.pShaderRecordName,
             CreateInfo.MaxAttributeSize,
             CreateInfo.MaxPayloadSize))
        return false;

    // Serialize RayTracingGeneralShaderGroup
    auto res =
        Ser.SerializeArray(Allocator, CreateInfo.pGeneralShaders, CreateInfo.GeneralShaderCount,
                           [&](Serializer<Mode>&                        Ser,
                               ConstQual<RayTracingGeneralShaderGroup>& Group) //
                           {
                               Uint32 ShaderIndex = ~0u;
                               if (IsWriting)
                               {
                                   ShaderToIndex(ShaderIndex, Group.pShader);
                               }

                               if (!Ser(Group.Name, ShaderIndex))
                                   return false;

                               VERIFY_EXPR(ShaderIndex != ~0u);
                               if (IsReading)
                               {
                                   ShaderToIndex(ShaderIndex, Group.pShader);
                               }

                               return true;
                           });
    if (!res) return false;

    // Serialize RayTracingTriangleHitShaderGroup
    res =
        Ser.SerializeArray(Allocator, CreateInfo.pTriangleHitShaders, CreateInfo.TriangleHitShaderCount,
                           [&](Serializer<Mode>&                            Ser,
                               ConstQual<RayTracingTriangleHitShaderGroup>& Group) //
                           {
                               Uint32 ClosestHitShaderIndex = ~0u;
                               Uint32 AnyHitShaderIndex     = ~0u;
                               if (IsWriting)
                               {
                                   ShaderToIndex(ClosestHitShaderIndex, Group.pClosestHitShader);
                                   ShaderToIndex(AnyHitShaderIndex, Group.pAnyHitShader);
                               }

                               if (!Ser(Group.Name, ClosestHitShaderIndex, AnyHitShaderIndex))
                                   return false;

                               VERIFY_EXPR(ClosestHitShaderIndex != ~0u);
                               if (IsReading)
                               {
                                   ShaderToIndex(ClosestHitShaderIndex, Group.pClosestHitShader);
                                   ShaderToIndex(AnyHitShaderIndex, Group.pAnyHitShader);
                               }

                               return true;
                           });
    if (!res) return false;

    // Serialize RayTracingProceduralHitShaderGroup
    res =
        Ser.SerializeArray(Allocator, CreateInfo.pProceduralHitShaders, CreateInfo.ProceduralHitShaderCount,
                           [&](Serializer<Mode>&                              Ser,
                               ConstQual<RayTracingProceduralHitShaderGroup>& Group) //
                           {
                               Uint32 IntersectionShaderIndex = ~0u;
                               Uint32 ClosestHitShaderIndex   = ~0u;
                               Uint32 AnyHitShaderIndex       = ~0u;
                               if (IsWriting)
                               {
                                   ShaderToIndex(IntersectionShaderIndex, Group.pIntersectionShader);
                                   ShaderToIndex(ClosestHitShaderIndex, Group.pClosestHitShader);
                                   ShaderToIndex(AnyHitShaderIndex, Group.pAnyHitShader);
                               }

                               if (!Ser(Group.Name, IntersectionShaderIndex, ClosestHitShaderIndex, AnyHitShaderIndex))
                                   return false;

                               VERIFY_EXPR(IntersectionShaderIndex != ~0u);
                               if (IsReading)
                               {
                                   ShaderToIndex(IntersectionShaderIndex, Group.pIntersectionShader);
                                   ShaderToIndex(ClosestHitShaderIndex, Group.pClosestHitShader);
                                   ShaderToIndex(AnyHitShaderIndex, Group.pAnyHitShader);
                               }

                               return true;
                           });
    return res;

    ASSERT_SIZEOF64(RayTracingPipelineStateCreateInfo, 168, "Did you add a new member to RayTracingPipelineStateCreateInfo? Please add serialization here.");
    ASSERT_SIZEOF64(RayTracingGeneralShaderGroup, 16, "Did you add a new member to RayTracingGeneralShaderGroup? Please add serialization here.");
    ASSERT_SIZEOF64(RayTracingTriangleHitShaderGroup, 24, "Did you add a new member to RayTracingTriangleHitShaderGroup? Please add serialization here.");
    ASSERT_SIZEOF64(RayTracingProceduralHitShaderGroup, 32, "Did you add a new member to RayTracingProceduralHitShaderGroup? Please add serialization here.");
}